

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O2

void Abc_TruthDecPerform(Abc_TtStore_t *p,int DecType,int fVerbose)

{
  word *pwVar1;
  word *pwVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  abctime aVar6;
  Vec_Str_t *vStr;
  Vec_Int_t *vCover;
  int *piVar7;
  Dec_Graph_t *pGraph;
  Bdc_Man_t *p_00;
  word *pwVar8;
  ulong uVar9;
  abctime aVar10;
  Kit_DsdNtk_t *pNtk;
  char *pcVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  char *pcVar15;
  int iVar16;
  ulong uVar17;
  word *pwVar18;
  ulong uVar19;
  word *pwVar20;
  ulong uVar21;
  ulong uVar22;
  undefined4 in_stack_fffffffffffff7d8;
  char pDsd [64];
  
  aVar6 = Abc_Clock();
  if (DecType == 1) {
    pcVar15 = "factoring";
  }
  else {
    if (4 < DecType - 2U) goto LAB_00277e3a;
    pcVar15 = &DAT_007ac390 + *(int *)(&DAT_007ac390 + (ulong)(DecType - 2U) * 4);
  }
  pcVar11 = "s";
  if (p->nFuncs == 1) {
    pcVar11 = "";
  }
  printf("Applying %-10s to %8d func%s of %2d vars...  ",pcVar15,(ulong)(uint)p->nFuncs,pcVar11);
LAB_00277e3a:
  if (fVerbose != 0) {
    putchar(10);
  }
  if (DecType == 1) {
    vStr = (Vec_Str_t *)malloc(0x10);
    vStr->nCap = 10000;
    vStr->nSize = 0;
    pcVar15 = (char *)malloc(10000);
    vStr->pArray = pcVar15;
    vCover = (Vec_Int_t *)malloc(0x10);
    vCover->nCap = 0x10000;
    vCover->nSize = 0;
    piVar7 = (int *)malloc(0x40000);
    vCover->pArray = piVar7;
    uVar14 = 0;
    for (uVar21 = 0; (long)uVar21 < (long)p->nFuncs; uVar21 = uVar21 + 1) {
      if (fVerbose != 0) {
        printf("%7d : ",uVar21 & 0xffffffff);
      }
      pcVar15 = Kit_PlaFromTruthNew((uint *)p->pFuncs[uVar21],p->nVars,vCover,vStr);
      pGraph = Dec_Factor(pcVar15);
      uVar14 = (ulong)(uint)(((int)uVar14 + pGraph->nSize) - pGraph->nLeaves);
      if (fVerbose != 0) {
        Dec_GraphPrint(_stdout,pGraph,(char **)0x0,(char *)0x0);
      }
      free(pGraph->pNodes);
      free(pGraph);
    }
    free(vCover->pArray);
    free(vCover);
    free(vStr->pArray);
    free(vStr);
  }
  else {
    switch(DecType) {
    case 2:
      pDsd[4] = '\0';
      pDsd[5] = '\0';
      pDsd[6] = '\0';
      pDsd[7] = '\0';
      pDsd[8] = '\0';
      pDsd[9] = '\0';
      pDsd[10] = '\0';
      pDsd[0xb] = '\0';
      pDsd._0_4_ = p->nVars;
      p_00 = Bdc_ManAlloc((Bdc_Par_t *)pDsd);
      uVar14 = 0;
      for (uVar21 = 0; (long)uVar21 < (long)p->nFuncs; uVar21 = uVar21 + 1) {
        if (fVerbose != 0) {
          printf("%7d :      ",uVar21 & 0xffffffff);
        }
        Bdc_ManDecompose(p_00,(uint *)p->pFuncs[uVar21],(uint *)0x0,p->nVars,(Vec_Ptr_t *)0x0,1000);
        iVar5 = Bdc_ManAndNum(p_00);
        if (fVerbose != 0) {
          Bdc_ManDecPrint(p_00);
        }
        uVar14 = (ulong)(uint)((int)uVar14 + iVar5);
      }
      Bdc_ManFree(p_00);
      break;
    case 3:
      uVar14 = 0;
      for (uVar21 = 0; (long)uVar21 < (long)p->nFuncs; uVar21 = uVar21 + 1) {
        if (fVerbose != 0) {
          printf("%7d :      ",uVar21 & 0xffffffff);
        }
        pNtk = Kit_DsdDecomposeMux((uint *)p->pFuncs[uVar21],p->nVars,3);
        if (fVerbose != 0) {
          Kit_DsdPrintExpanded(pNtk);
          putchar(10);
        }
        iVar5 = Kit_DsdCountAigNodes(pNtk);
        uVar14 = (ulong)(uint)((int)uVar14 + iVar5);
        Kit_DsdNtkFree(pNtk);
      }
      break;
    case 4:
      uVar14 = 0;
      for (uVar21 = 0; (long)uVar21 < (long)p->nFuncs; uVar21 = uVar21 + 1) {
        if (fVerbose == 0) {
          Dau_DsdDecompose(p->pFuncs[uVar21],p->nVars,0,1,pDsd);
        }
        else {
          printf("%7d :      ",uVar21 & 0xffffffff);
          Dau_DsdDecompose(p->pFuncs[uVar21],p->nVars,0,1,pDsd);
          puts(pDsd);
        }
        iVar5 = Dau_DsdCountAnds((char *)CONCAT44(fVerbose,in_stack_fffffffffffff7d8));
        uVar14 = (ulong)(uint)((int)uVar14 + iVar5);
      }
      break;
    case 5:
      for (uVar14 = 0; (long)uVar14 < (long)p->nFuncs; uVar14 = uVar14 + 1) {
        uVar3 = p->nVars;
        uVar12 = 1 << ((char)uVar3 - 6U & 0x1f);
        pwVar8 = p->pFuncs[uVar14];
        uVar9 = 0;
        uVar21 = (ulong)uVar12;
        if ((int)uVar12 < 1) {
          uVar21 = uVar9;
        }
        uVar19 = 0;
        if (0 < (int)uVar3) {
          uVar19 = (ulong)uVar3;
        }
        iVar5 = 0;
        for (; uVar9 != uVar19; uVar9 = uVar9 + 1) {
          bVar4 = (byte)uVar9;
          if ((int)uVar3 < 7) {
            if ((s_Truths6Neg[uVar9] & (*pwVar8 >> ((byte)(1 << (bVar4 & 0x1f)) & 0x3f) ^ *pwVar8))
                != 0) {
LAB_002781e0:
              iVar5 = iVar5 + 1;
            }
          }
          else {
            if (uVar9 < 6) {
              uVar17 = 0;
              do {
                if (uVar21 == uVar17) goto LAB_002781e3;
                pwVar20 = pwVar8 + uVar17;
                uVar17 = uVar17 + 1;
              } while ((s_Truths6Neg[uVar9] &
                       (*pwVar20 >> ((byte)(1 << (bVar4 & 0x1f)) & 0x3f) ^ *pwVar20)) == 0);
              goto LAB_002781e0;
            }
            uVar13 = 1 << (bVar4 - 6 & 0x1f);
            iVar16 = 2 << (bVar4 - 6 & 0x1f);
            uVar17 = 0;
            if (0 < (int)uVar13) {
              uVar17 = (ulong)uVar13;
            }
            pwVar20 = pwVar8 + (int)uVar13;
            for (pwVar18 = pwVar8; pwVar18 < pwVar8 + (int)uVar12; pwVar18 = pwVar18 + iVar16) {
              uVar22 = 0;
              while (uVar17 != uVar22) {
                pwVar1 = pwVar18 + uVar22;
                pwVar2 = pwVar20 + uVar22;
                uVar22 = uVar22 + 1;
                if (*pwVar1 != *pwVar2) goto LAB_002781e0;
              }
              pwVar20 = pwVar20 + iVar16;
            }
          }
LAB_002781e3:
        }
        if (fVerbose == 0) {
          Dau_DecTrySets(pwVar8,iVar5,0);
        }
        else {
          iVar16 = fVerbose;
          printf("%7d :      ",uVar14 & 0xffffffff);
          Dau_DecTrySets(p->pFuncs[uVar14],iVar5,fVerbose);
          putchar(10);
          fVerbose = iVar16;
        }
      }
      uVar14 = 0;
      break;
    case 6:
      pwVar8 = Dsc_alloc_pool(p->nVars);
      uVar14 = 0;
      for (uVar21 = 0; (long)uVar21 < (long)p->nFuncs; uVar21 = uVar21 + 1) {
        if (fVerbose == 0) {
          Dsc_Decompose(p->pFuncs[uVar21],p->nVars,pDsd,pwVar8);
        }
        else {
          printf("%7d :      ",uVar21 & 0xffffffff);
          Dsc_Decompose(p->pFuncs[uVar21],p->nVars,pDsd,pwVar8);
          pcVar15 = pDsd;
          if (pDsd[0] == '\0') {
            pcVar15 = "NULL";
          }
          puts(pcVar15);
        }
        iVar5 = Dsc_CountAnds((char *)CONCAT44(fVerbose,in_stack_fffffffffffff7d8));
        uVar14 = (ulong)(uint)((int)uVar14 + iVar5);
      }
      Dsc_free_pool(pwVar8);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDec.c"
                    ,0x2a7,"void Abc_TruthDecPerform(Abc_TtStore_t *, int, int)");
    }
  }
  printf("AIG nodes =%9d  ",uVar14);
  aVar10 = Abc_Clock();
  Abc_Print(1,"%s =","Time");
  Abc_Print(1,"%9.2f sec\n",(double)(aVar10 - aVar6) / 1000000.0);
  return;
}

Assistant:

void Abc_TruthDecPerform( Abc_TtStore_t * p, int DecType, int fVerbose )
{
    abctime clk = Abc_Clock();
    int i, nNodes = 0;

    char * pAlgoName = NULL;
    if ( DecType == 1 )
        pAlgoName = "factoring";
    else if ( DecType == 2 )
        pAlgoName = "bi-decomp";
    else if ( DecType == 3 )
        pAlgoName = "DSD";
    else if ( DecType == 4 )
        pAlgoName = "fast DSD";
    else if ( DecType == 5 )
        pAlgoName = "analysis";
    else if ( DecType == 6 )
            pAlgoName = "DSD ICCD'15";

    if ( pAlgoName )
        printf( "Applying %-10s to %8d func%s of %2d vars...  ",  
            pAlgoName, p->nFuncs, (p->nFuncs == 1 ? "":"s"), p->nVars );
    if ( fVerbose )
        printf( "\n" );

    if ( DecType == 1 )
    {
        // perform algebraic factoring and count AIG nodes
        Dec_Graph_t * pFForm;
        Vec_Int_t * vCover;
        Vec_Str_t * vStr;
        char * pSopStr;
        vStr = Vec_StrAlloc( 10000 );
        vCover = Vec_IntAlloc( 1 << 16 );
        for ( i = 0; i < p->nFuncs; i++ )
        {
//            extern int Abc_IsopTest( word * pFunc, int nVars, Vec_Int_t * vCover );
//            if ( i == 0 ) printf( "\n" );
//            Abc_IsopTest( p->pFuncs[i], p->nVars, vCover );
//            continue;
            if ( fVerbose )
                printf( "%7d : ", i );
            pSopStr = Kit_PlaFromTruthNew( (unsigned *)p->pFuncs[i], p->nVars, vCover, vStr );
            pFForm = Dec_Factor( pSopStr );
            nNodes += Dec_GraphNodeNum( pFForm );
            if ( fVerbose )
                Dec_GraphPrint( stdout, pFForm, NULL, NULL );
            Dec_GraphFree( pFForm );
        }
        Vec_IntFree( vCover );
        Vec_StrFree( vStr );
    }
    else if ( DecType == 2 )
    {
        // perform bi-decomposition and count AIG nodes
        Bdc_Man_t * pManDec;
        Bdc_Par_t Pars = {0}, * pPars = &Pars;
        pPars->nVarsMax = p->nVars;
        pManDec = Bdc_ManAlloc( pPars );
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d :      ", i );
            Bdc_ManDecompose( pManDec, (unsigned *)p->pFuncs[i], NULL, p->nVars, NULL, 1000 );
            nNodes += Bdc_ManAndNum( pManDec );
            if ( fVerbose )
                Bdc_ManDecPrint( pManDec );
        }
        Bdc_ManFree( pManDec );
    }
    else if ( DecType == 3 )
    {
        // perform disjoint-support decomposition and count AIG nodes
        // (non-DSD blocks are decomposed into 2:1 MUXes, each counting as 3 AIG nodes)
        Kit_DsdNtk_t * pNtk;
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d :      ", i );
            pNtk = Kit_DsdDecomposeMux( (unsigned *)p->pFuncs[i], p->nVars, 3 );
            if ( fVerbose )
                Kit_DsdPrintExpanded( pNtk ), printf( "\n" );
            nNodes += Kit_DsdCountAigNodes( pNtk );
            Kit_DsdNtkFree( pNtk );
        }
    }
    else if ( DecType == 4 )
    {
        char pDsd[DAU_MAX_STR];
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d :      ", i );
            Dau_DsdDecompose( p->pFuncs[i], p->nVars, 0, 1, pDsd );
            if ( fVerbose )
                printf( "%s\n", pDsd );
            nNodes += Dau_DsdCountAnds( pDsd );
        }
    }
    else if ( DecType == 5 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            extern void Dau_DecTrySets( word * pInit, int nVars, int fVerbose );
            int nSuppSize = Abc_TtSupportSize( p->pFuncs[i], p->nVars );
            if ( fVerbose )
                printf( "%7d :      ", i );
            Dau_DecTrySets( p->pFuncs[i], nSuppSize, fVerbose );
            if ( fVerbose )
                printf( "\n" );
        }
    } else if ( DecType == 6 )
    {
        char pDsd[DSC_MAX_STR];
        /* memory pool with a capacity of storing 3*nVars
        truth-tables for negative and positive cofactors and
        the boolean difference for each input variable */
        word *mem_pool = Dsc_alloc_pool(p->nVars);
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d :      ", i );
            Dsc_Decompose(p->pFuncs[i], p->nVars, pDsd, mem_pool);
            if ( fVerbose )
                printf( "%s\n", pDsd[0] ? pDsd : "NULL");
            nNodes += Dsc_CountAnds( pDsd );
        }
        Dsc_free_pool(mem_pool);
    }
    else assert( 0 );

    printf( "AIG nodes =%9d  ", nNodes );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}